

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O2

int graph_5_4::prim_5(m_graph g)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int i;
  long lVar7;
  int i_1;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uStack_30;
  
  uVar6 = (ulong)(uint)g.vexs[8];
  lVar4 = -(uVar6 * 4 + 0xf & 0xfffffffffffffff0);
  lVar5 = lVar4 + -0x28;
  *(undefined8 *)((long)&uStack_30 + lVar4) = 1;
  for (lVar7 = *(long *)((long)&uStack_30 + lVar4); lVar7 < g.vexs[8]; lVar7 = lVar7 + 1) {
    *(undefined4 *)(&stack0xffffffffffffffd8 + lVar7 * 4 + lVar5 + 0x28) =
         *(undefined4 *)((long)(g.arc + -1) + 0x20 + lVar7 * 4);
  }
  *(undefined8 *)((long)&uStack_30 + lVar4) = 1;
  uVar2 = *(ulong *)((long)&uStack_30 + lVar4);
  *(undefined8 *)((long)&uStack_30 + lVar4) = 0xffffffffffffffff;
  uVar3 = *(ulong *)((long)&uStack_30 + lVar4);
  uVar8 = uVar2;
  do {
    uVar9 = 0;
    uVar11 = uVar3 & 0xffffffff;
    for (uVar10 = uVar2; uVar10 != uVar6; uVar10 = uVar10 + 1) {
      if ((*(int *)(&stack0xffffffffffffffd8 + uVar8 * 4 + lVar5 + 0x28) != 0) &&
         ((int)*(uint *)(&stack0xffffffffffffffd8 + uVar10 * 4 + lVar5 + 0x28) < (int)uVar11)) {
        uVar9 = uVar10 & 0xffffffff;
        uVar11 = (ulong)*(uint *)(&stack0xffffffffffffffd8 + uVar10 * 4 + lVar5 + 0x28);
      }
      *(undefined4 *)(&stack0xffffffffffffffd8 + (long)(int)uVar9 * 4 + lVar5 + 0x28) = 0;
      for (uVar12 = uVar2; uVar6 != uVar12; uVar12 = uVar12 + 1) {
        if ((*(int *)(&stack0xffffffffffffffd8 + uVar12 * 4 + lVar5 + 0x28) != 0) &&
           (iVar1 = g.arc[(long)(int)uVar9 + -1][uVar12 + 8],
           *(int *)(&stack0xffffffffffffffd8 + uVar12 * 4 + lVar5 + 0x28) < iVar1)) {
          *(int *)(&stack0xffffffffffffffd8 + uVar12 * 4 + lVar5 + 0x28) = iVar1;
        }
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

int prim_5(m_graph g) {
        int dis[g.vnum], adjvex[g.vnum], min, j, k;
        for (int i = 1; i < g.vnum; i++) {
            dis[i] = g.arc[0][i];
            adjvex[i] = 0;
        }
        dis[0] = 0;
        adjvex[0] = 0;

        for (int i = 1; i < g.vnum; i++) {
            min = INTMAX_MAX, j = 1, k = 0;
            while (j < g.vnum) {
                if (dis[i] != 0 && dis[j] < min) {
                    min = dis[j];
                    k = j;
                }
                //visit(k);
                j++;
                dis[k] = 0;
                for (int p = 1; p < g.vnum; p++) {
                    if (dis[p] != 0 && dis[p] < g.arc[k][p]) {
                        dis[p] = g.arc[k][p];
                        adjvex[p] = k;
                    }
                }
            }
        }
    }